

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::sendCommand
          (CoreBroker *this,string_view target,string_view commandStr,HelicsSequencingModes mode)

{
  action_t startingAction;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  string_view queryStr;
  string_view commandStr_local;
  ActionMessage cmdcmd;
  string local_48;
  
  commandStr_local._M_str = commandStr._M_str;
  commandStr_local._M_len = commandStr._M_len;
  __y._M_str = "flush";
  __y._M_len = 5;
  bVar1 = std::operator==(commandStr,__y);
  if (!bVar1) {
    startingAction = cmd_send_command;
    if (mode == HELICS_SEQUENCING_MODE_ORDERED) {
      startingAction = cmd_send_command_ordered;
    }
    ActionMessage::ActionMessage(&cmdcmd,startingAction);
    cmdcmd.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
    SmallBuffer::operator=(&cmdcmd.payload,&commandStr_local);
    ActionMessage::setString(&cmdcmd,0,(string_view)target);
    str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    str._M_len = (this->super_BrokerBase).identifier._M_string_length;
    ActionMessage::setString(&cmdcmd,1,str);
    __y_00._M_str = "broker";
    __y_00._M_len = 6;
    bVar1 = std::operator==(target,__y_00);
    if ((((bVar1) ||
         (__y_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p,
         __y_01._M_len = (this->super_BrokerBase).identifier._M_string_length,
         bVar1 = std::operator==(target,__y_01), target._M_len == 0 || bVar1)) ||
        ((__y_02._M_str = "root", __y_02._M_len = 4, bVar1 = std::operator==(target,__y_02), bVar1
         && (((this->super_BrokerBase).field_0x293 & 1) != 0)))) ||
       ((__y_03._M_str = "federation", __y_03._M_len = 10, bVar1 = std::operator==(target,__y_03),
        bVar1 && (((this->super_BrokerBase).field_0x293 & 1) != 0)))) {
      BrokerBase::addActionMessage(&this->super_BrokerBase,&cmdcmd);
    }
    else {
      transmitToParent(this,&cmdcmd);
    }
    ActionMessage::~ActionMessage(&cmdcmd);
    return;
  }
  queryStr._M_str = "global_flush";
  queryStr._M_len = 0xc;
  query_abi_cxx11_(&local_48,this,target,queryStr,HELICS_SEQUENCING_MODE_ORDERED);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CoreBroker::sendCommand(std::string_view target,
                             std::string_view commandStr,
                             HelicsSequencingModes mode)
{
    if (commandStr == "flush") {
        query(target, "global_flush", HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        return;
    }
    ActionMessage cmdcmd(mode == HELICS_SEQUENCING_MODE_ORDERED ? CMD_SEND_COMMAND_ORDERED :
                                                                  CMD_SEND_COMMAND);
    cmdcmd.source_id = global_id.load();
    cmdcmd.payload = commandStr;
    cmdcmd.setString(targetStringLoc, target);
    cmdcmd.setString(sourceStringLoc, getIdentifier());

    if (target == "broker" || target == getIdentifier() || target.empty() ||
        (target == "root" && _isRoot) || (target == "federation" && _isRoot)) {
        addActionMessage(std::move(cmdcmd));
    } else {
        transmitToParent(std::move(cmdcmd));
    }
}